

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QDockAreaLayoutItem *item)

{
  QDockWidget ***debug;
  QLayoutItem *pQVar1;
  QDebug *pQVar2;
  QObject *object;
  QDockWidget *pQVar3;
  QDockWidgetGroupWindow *this;
  long *in_RDX;
  QWidget *widget;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  Stream *local_90;
  Stream *local_88;
  QArrayDataPointer<QDockWidget_*> local_80;
  QWidgetData *local_68;
  undefined1 local_60 [8];
  QList<QDockWidget_*> local_58;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_40,(QDebug *)item);
  *(undefined1 *)&item->widgetItem[3]._vptr_QLayoutItem = 0;
  pQVar2 = QDebug::operator<<((QDebug *)item,"QDockAreaLayoutItem(");
  pQVar2 = QDebug::operator<<(pQVar2,in_RDX);
  QDebug::operator<<(pQVar2,"->");
  if ((long *)*in_RDX == (long *)0x0) {
    if (in_RDX[1] == 0) {
      if (in_RDX[2] != 0) {
        pQVar2 = QDebug::operator<<((QDebug *)item,"placeHolderItem(");
        pQVar2 = QDebug::operator<<(pQVar2,(void *)in_RDX[2]);
        QDebug::operator<<(pQVar2,")");
      }
      goto LAB_003c8425;
    }
    pQVar2 = QDebug::operator<<((QDebug *)item,"subInfo(");
    pQVar2 = QDebug::operator<<(pQVar2,(void *)in_RDX[1]);
    pQVar2 = QDebug::operator<<(pQVar2,"->(");
    local_90 = pQVar2->stream;
    widget = (QWidget *)&local_90;
    *(int *)(local_90 + 0x28) = *(int *)(local_90 + 0x28) + 1;
    operator<<((Stream *)&local_80,(QList<QDockAreaLayoutItem> *)widget);
    QDebug::operator<<((QDebug *)&local_80,")");
LAB_003c8418:
    QDebug::~QDebug((QDebug *)&local_80);
  }
  else {
    object = (QObject *)(**(code **)(*(long *)*in_RDX + 0x68))();
    pQVar3 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(object);
    if (pQVar3 == (QDockWidget *)0x0) {
      this = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>(object);
      if (this == (QDockWidgetGroupWindow *)0x0) {
        pQVar2 = QDebug::operator<<((QDebug *)item,"widgetItem(");
        local_88 = pQVar2->stream;
        widget = (QWidget *)&local_88;
        *(int *)(local_88 + 0x28) = *(int *)(local_88 + 0x28) + 1;
        operator<<((Stream *)&local_80,widget);
        QDebug::operator<<((QDebug *)&local_80,")");
        goto LAB_003c8418;
      }
      pQVar2 = QDebug::operator<<((QDebug *)item,"widgetItem(");
      local_68 = (QWidgetData *)pQVar2->stream;
      *(int *)&(local_68->pal).d = *(int *)&(local_68->pal).d + 1;
      operator<<((Stream *)local_60,(QWidget *)&local_68);
      pQVar2 = QDebug::operator<<((QDebug *)local_60,"->(");
      local_58.d.d = (Data *)pQVar2->stream;
      *(int *)((long)local_58.d.d + 0x28) = *(int *)((long)local_58.d.d + 0x28) + 1;
      QDockWidgetGroupWindow::dockWidgets
                ((QList<QDockWidget_*> *)&local_80,(QDockWidgetGroupWindow *)this);
      debug = &local_58.d.ptr;
      operator<<((QDebug)debug,&local_58);
      QDebug::operator<<((QDebug *)debug,"))");
      QDebug::~QDebug((QDebug *)debug);
      QArrayDataPointer<QDockWidget_*>::~QArrayDataPointer(&local_80);
      QDebug::~QDebug((QDebug *)&local_58);
      QDebug::~QDebug((QDebug *)local_60);
      widget = (QWidget *)&local_68;
    }
    else {
      pQVar2 = QDebug::operator<<((QDebug *)item,"widgetItem(");
      local_58.d.size = (qsizetype)pQVar2->stream;
      widget = (QWidget *)&local_58.d.size;
      *(int *)&(((QWidgetData *)local_58.d.size)->pal).d =
           *(int *)&(((QWidgetData *)local_58.d.size)->pal).d + 1;
      operator<<((Stream *)&local_80,(QDockWidget *)widget);
      QDebug::operator<<((QDebug *)&local_80,")");
      QDebug::~QDebug((QDebug *)&local_80);
    }
  }
  QDebug::~QDebug((QDebug *)widget);
LAB_003c8425:
  QDebug::operator<<((QDebug *)item,")");
  pQVar1 = item->widgetItem;
  item->widgetItem = (QLayoutItem *)0x0;
  *(QLayoutItem **)dbg.stream = pQVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QDockAreaLayoutItem &item)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QDockAreaLayoutItem(" << static_cast<const void *>(&item) << "->";
    if (item.widgetItem) {
        QWidget *widget = item.widgetItem->widget();
        if (auto *dockWidget = qobject_cast<QDockWidget *>(widget)) {
            dbg << "widgetItem(" << dockWidget << ")";
        } else if (auto *groupWindow = qobject_cast<QDockWidgetGroupWindow *>(widget)) {
            dbg << "widgetItem(" << groupWindow << "->(" << groupWindow->dockWidgets() << "))";
        } else {
            dbg << "widgetItem(" << widget << ")";
        }
    } else if (item.subinfo) {
        dbg << "subInfo(" << item.subinfo << "->(" << item.subinfo->item_list << ")";
    } else if (item.placeHolderItem) {
        dbg << "placeHolderItem(" << item.placeHolderItem << ")";
    }
    dbg << ")";
    return dbg;
}